

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSParticle.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XSParticle::XSParticle
          (XSParticle *this,TERM_TYPE termType,XSModel *xsModel,XSObject *particleTerm,
          XMLSize_t minOccurs,XMLSize_t maxOccurs,bool unbounded,MemoryManager *manager)

{
  XSObject::XSObject(&this->super_XSObject,PARTICLE,xsModel,manager);
  (this->super_XSObject)._vptr_XSObject = (_func_int **)&PTR__XSParticle_00400aa0;
  this->fTermType = termType;
  this->fMinOccurs = minOccurs;
  this->fMaxOccurs = maxOccurs;
  this->fUnbounded = unbounded;
  this->fTerm = particleTerm;
  return;
}

Assistant:

XSParticle::XSParticle(TERM_TYPE            termType,
                       XSModel* const       xsModel,
                       XSObject* const      particleTerm,
                       XMLSize_t            minOccurs,
                       XMLSize_t            maxOccurs,
                       bool                 unbounded,
                       MemoryManager* const manager)
    : XSObject(XSConstants::PARTICLE, xsModel, manager)
    , fTermType(termType)
    , fMinOccurs(minOccurs)
    , fMaxOccurs(maxOccurs)
    , fUnbounded (unbounded)
    , fTerm(particleTerm)
{
}